

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitCompoundStatement(SyntaxDumper *this,CompoundStatementSyntax *node)

{
  long lVar1;
  CompoundStatementSyntax *pCVar2;
  CompoundStatementSyntax local_50 [56];
  
  CompoundStatementSyntax::openBraceToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pCVar2 = node + 0x20;
  while (lVar1 = *(long *)pCVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pCVar2 = (CompoundStatementSyntax *)(lVar1 + 0x10);
  }
  CompoundStatementSyntax::closeBraceToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitCompoundStatement(const CompoundStatementSyntax* node) override
    {
        terminal(node->openBraceToken(), node);
        for (auto iter = node->statements(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->closeBraceToken(), node);
        return Action::Skip;
    }